

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
args::PositionalBase::GetProgramLine_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,PositionalBase *this,HelpParams *params)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ec;
  undefined1 local_eb;
  byte local_ea;
  byte local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  byte local_a6;
  byte local_a5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  HelpParams *params_local;
  PositionalBase *this_local;
  
  local_eb = 1;
  local_58 = &local_50;
  local_20 = (undefined1  [8])params;
  params_local = (HelpParams *)this;
  this_local = (PositionalBase *)__return_storage_ptr__;
  bVar1 = Base::IsRequired((Base *)this);
  local_a5 = 0;
  local_a6 = 0;
  local_e9 = 0;
  local_ea = 0;
  if (bVar1) {
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)local_20 + 0x150);
    (*(this->super_NamedBase).super_Base._vptr_Base[0x12])(&local_98);
    local_a5 = 1;
    std::operator+(&local_78,pbVar2,&local_98);
    local_a6 = 1;
    std::operator+(&local_50,&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)local_20 + 0x170));
  }
  else {
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)local_20 + 400);
    (*(this->super_NamedBase).super_Base._vptr_Base[0x12])(&local_e8);
    local_e9 = 1;
    std::operator+(&local_c8,pbVar2,&local_e8);
    local_ea = 1;
    std::operator+(&local_50,&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)local_20 + 0x1b0));
  }
  local_eb = 0;
  local_30 = &local_50;
  local_28 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_ec);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,__l,&local_ec);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_ec);
  local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30;
  do {
    local_128 = local_128 + -1;
    std::__cxx11::string::~string((string *)local_128);
  } while (local_128 != &local_50);
  if ((local_ea & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_c8);
  }
  if ((local_e9 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_e8);
  }
  if ((local_a6 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((local_a5 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<std::string> GetProgramLine(const HelpParams &params) const override
            {
                return { IsRequired() ? params.proglineRequiredOpen + Name() + params.proglineRequiredClose
                                      : params.proglineNonrequiredOpen + Name() + params.proglineNonrequiredClose };
            }